

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O1

void __thiscall Triangle_Reintersect_Test::TestBody(Triangle_Reintersect_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  uint uVar6;
  Triangle *pTVar7;
  ulong uVar8;
  float *pfVar9;
  Point3f *pPVar10;
  byte bVar11;
  ulong uVar12;
  long lVar13;
  Curve *this_00;
  char *in_R9;
  char *expected_predicate_value;
  int j;
  int iVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  int k;
  int iVar16;
  float fVar17;
  undefined1 auVar18 [16];
  Point2f u;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_ZMM4 [64];
  AssertionResult gtest_ar__1;
  Ray rOut;
  AssertionResult gtest_ar_;
  optional<pbrt::ShapeSample> ts;
  optional<pbrt::ShapeIntersection> si;
  AssertHelper local_3c8;
  DispatchSplit<6> local_3c0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b8;
  undefined1 local_3b0 [8];
  undefined1 local_3a8 [8];
  float local_3a0 [2];
  float local_398;
  DispatchSplit<6> local_391;
  ulong local_390;
  long local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_380;
  char *local_378;
  float local_36c;
  undefined8 local_368;
  long local_360;
  AssertHelper local_358;
  float fStack_350;
  float fStack_34c;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_338;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  float local_328;
  undefined8 local_324;
  float local_31c;
  undefined4 local_318;
  undefined8 local_310;
  _Any_data local_308;
  code *pcStack_2f8;
  code *pcStack_2f0;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  Tuple3<pbrt::Vector3,_float> local_2c0;
  undefined1 local_2b0 [12];
  float fStack_2a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_290;
  byte local_1b0;
  aligned_storage_t<sizeof(pbrt::ShapeSample),_alignof(pbrt::ShapeSample)> local_1a8;
  char local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [256];
  char local_38;
  
  lVar13 = 0;
  do {
    uVar12 = ((ulong)(lVar13 * 0x7fb5d329728ea185) >> 0x1b ^ lVar13 * 0x7fb5d329728ea185) *
             -0x7e25210b43d22bb3;
    local_388 = lVar13 * 2 + 1;
    local_390 = ((uVar12 >> 0x21 ^ uVar12) + 1) * 0x5851f42d4c957f2d + lVar13 * -0x4f5c17a566d501a4
                + 1;
    local_308._8_8_ = 0;
    local_308._M_unused._M_object = &local_390;
    pcStack_2f0 = std::
                  _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp:158:45)>
                  ::_M_invoke;
    pcStack_2f8 = std::
                  _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp:158:45)>
                  ::_M_manager;
    in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
    pTVar7 = GetRandomTriangle((function<float_()> *)&local_308);
    if (pcStack_2f8 != (code *)0x0) {
      (*pcStack_2f8)(&local_308,&local_308,__destroy_functor);
    }
    this_00 = (Curve *)((ulong)pTVar7 & 0xffffffffffff);
    if (this_00 == (Curve *)0x0) {
      bVar5 = false;
    }
    else {
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((ulong)pTVar7 | 0x4000000000000);
      uVar12 = local_390 * 0x5851f42d4c957f2d + local_388;
      uVar8 = uVar12 * 0x5851f42d4c957f2d + local_388;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_390;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar12;
      auVar21 = vpunpcklqdq_avx(auVar20,auVar23);
      auVar18 = vpsrlvq_avx2(auVar21,_DAT_005655c0);
      auVar20 = vpsrlvq_avx2(auVar21,_DAT_005655d0);
      auVar18 = vpshufd_avx(auVar18 ^ auVar20,0xe8);
      auVar21 = vpsrlq_avx(auVar21,0x3b);
      auVar21 = vpshufd_avx(auVar21,0xe8);
      auVar18 = vprorvd_avx512vl(auVar18,auVar21);
      auVar21 = vcvtudq2ps_avx512vl(auVar18);
      auVar18._8_4_ = 0x2f800000;
      auVar18._0_8_ = 0x2f8000002f800000;
      auVar18._12_4_ = 0x2f800000;
      auVar18 = vmulps_avx512vl(auVar21,auVar18);
      auVar21._8_4_ = 0x3f7fffff;
      auVar21._0_8_ = 0x3f7fffff3f7fffff;
      auVar21._12_4_ = 0x3f7fffff;
      auVar18 = vminps_avx512vl(auVar18,auVar21);
      local_378 = (char *)((ulong)paVar15 >> 0x30);
      u.super_Tuple2<pbrt::Point2,_float> = auVar18._0_8_;
      local_390 = uVar8;
      if (local_378 == &DAT_00000005) {
        pbrt::BilinearPatch::Sample
                  ((optional<pbrt::ShapeSample> *)&local_1a8.__align,(BilinearPatch *)this_00,u);
      }
      else if ((short)((ulong)paVar15 >> 0x30) == 4) {
        pbrt::Triangle::Sample
                  ((optional<pbrt::ShapeSample> *)&local_1a8.__align,(Triangle *)this_00,u);
      }
      else {
        pbrt::Curve::Sample((optional<pbrt::ShapeSample> *)&local_1a8.__align,this_00,u);
      }
      local_2b0[0] = local_150;
      local_2b0._8_4_ = 0.0;
      fStack_2a4 = 0.0;
      if (local_150 == '\0') {
        testing::Message::Message((Message *)&local_330);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_138,(internal *)local_2b0,(AssertionResult *)"ts.has_value()",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_358,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                   ,0xa7,(char *)local_138._0_8_);
        testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_330);
        testing::internal::AssertHelper::~AssertHelper(&local_358);
        if (local_138._0_8_ != (long)local_138 + 0x10) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
        }
        if (local_330.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) &&
             (local_330.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_330.ptr_ + 8))();
          }
          local_330.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_2b0 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        bVar5 = true;
      }
      else {
        local_380 = paVar15;
        local_360 = lVar13;
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_2b0 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_368 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_36c = 0.0;
        iVar14 = 0;
        do {
          uVar6 = (uint)(local_390 >> 0x2d) ^ (uint)(local_390 >> 0x1b);
          bVar11 = (byte)(local_390 >> 0x3b);
          auVar18 = vcvtusi2ss_avx512f(in_ZMM4._0_16_,uVar6 >> bVar11 | uVar6 << 0x20 - bVar11);
          auVar18 = vminss_avx(ZEXT416((uint)(auVar18._0_4_ * 2.3283064e-10)),
                               SUB6416(ZEXT464(0x3f7fffff),0));
          auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * 8.0)),
                                    ZEXT416((uint)(1.0 - auVar18._0_4_)),ZEXT416(0xc1000000));
          local_390 = local_390 * 0x5851f42d4c957f2d + local_388;
          dVar19 = pow(10.0,(double)auVar18._0_4_);
          pfVar9 = (float *)&local_368;
          if ((iVar14 != 0) && (pfVar9 = (float *)((long)&local_368 + 4), iVar14 != 1)) {
            pfVar9 = &local_36c;
          }
          *pfVar9 = (float)dVar19;
          iVar14 = iVar14 + 1;
        } while (iVar14 != 3);
        if (local_150 == '\0') {
          pbrt::LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
        }
        auVar24._8_8_ = 0;
        auVar24._0_8_ = local_368;
        auVar4._4_8_ = local_1a8._4_8_;
        auVar4._0_4_ = local_1a8._0_4_;
        auVar4._12_4_ = local_1a8._12_4_;
        in_ZMM4 = ZEXT864((ulong)local_1a8._4_8_);
        auVar18 = vinsertps_avx(auVar4,ZEXT416((uint)local_1a8._12_4_),0x10);
        auVar26._0_4_ = (float)local_1a8._4_8_ + auVar18._0_4_;
        auVar26._4_4_ = (float)((ulong)local_1a8._4_8_ >> 0x20) + auVar18._4_4_;
        auVar26._8_4_ = auVar18._8_4_ + 0.0;
        auVar26._12_4_ = auVar18._12_4_ + 0.0;
        auVar1._8_4_ = 0x3f000000;
        auVar1._0_8_ = 0x3f0000003f000000;
        auVar1._12_4_ = 0x3f000000;
        auVar18 = vmulps_avx512vl(auVar26,auVar1);
        auVar18 = vsubps_avx(auVar18,auVar24);
        local_31c = ((float)local_1a8._16_4_ + (float)local_1a8._20_4_) * 0.5 - local_36c;
        local_330.ptr_ = local_368;
        local_328 = local_36c;
        local_324 = vmovlps_avx(auVar18);
        local_318 = 0;
        local_310 = 0;
        local_358.data_._0_4_ = 0x7f800000;
        local_2b0._0_8_ = local_380;
        in_R9 = local_378;
        pbrt::DispatchSplit<6>::operator()(local_138,local_3c0,&local_330,&local_358,local_2b0);
        if (local_38 == '\x01') {
          iVar14 = 0;
          do {
            uVar12 = local_390 * 0x5851f42d4c957f2d + local_388;
            uVar8 = uVar12 * 0x5851f42d4c957f2d + local_388;
            auVar22._8_8_ = 0;
            auVar22._0_8_ = local_390;
            auVar25._8_8_ = 0;
            auVar25._0_8_ = uVar12;
            auVar21 = vpunpcklqdq_avx(auVar25,auVar22);
            auVar18 = vpsrlvq_avx2(auVar21,_DAT_005655d0);
            auVar20 = vpsrlvq_avx2(auVar21,_DAT_005655c0);
            auVar18 = vpshufd_avx(auVar20 ^ auVar18,0xe8);
            auVar21 = vpsrlq_avx(auVar21,0x3b);
            auVar21 = vpshufd_avx(auVar21,0xe8);
            auVar18 = vprorvd_avx512vl(auVar18,auVar21);
            auVar18 = vcvtudq2ps_avx512vl(auVar18);
            auVar2._8_4_ = 0x2f800000;
            auVar2._0_8_ = 0x2f8000002f800000;
            auVar2._12_4_ = 0x2f800000;
            auVar21 = vmulps_avx512vl(auVar18,auVar2);
            auVar3._8_4_ = 0x3f7fffff;
            auVar3._0_8_ = 0x3f7fffff3f7fffff;
            auVar3._12_4_ = 0x3f7fffff;
            uVar12 = vcmpps_avx512vl(auVar21,auVar3,1);
            bVar11 = (byte)(uVar12 >> 1);
            auVar18 = vmovshdup_avx(auVar21);
            local_2e8._0_4_ = auVar21._0_4_ * 6.2831855;
            local_148 = vfmadd132ss_fma(ZEXT416((uint)(bVar11 & 1) * auVar18._0_4_ +
                                                (uint)!(bool)(bVar11 & 1) * 0x3f7fffff),
                                        SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
            auVar18 = vfnmadd213ss_fma(local_148,local_148,SUB6416(ZEXT464(0x3f800000),0));
            auVar18 = vmaxss_avx(auVar18,ZEXT816(0));
            local_390 = uVar8;
            if (auVar18._0_4_ < 0.0) {
              local_2d8._0_4_ = (int)uVar12;
              local_2e8 = ZEXT416((uint)local_2e8._0_4_);
              local_398 = sqrtf(auVar18._0_4_);
              uVar12 = (ulong)(uint)local_2d8._0_4_;
            }
            else {
              auVar18 = vsqrtss_avx(auVar18,auVar18);
              local_398 = auVar18._0_4_;
            }
            fVar17 = (float)((uint)((byte)uVar12 & 1) * local_2e8._0_4_ +
                            (uint)!(bool)((byte)uVar12 & 1) * 0x40c90fda);
            local_2e8 = ZEXT416((uint)fVar17);
            fVar17 = cosf(fVar17);
            local_2d8 = ZEXT416((uint)(fVar17 * local_398));
            fVar17 = sinf((float)local_2e8._0_4_);
            auVar18 = vinsertps_avx(local_2d8,ZEXT416((uint)(fVar17 * local_398)),0x10);
            local_2c0._0_8_ = vmovlps_avx(auVar18);
            local_2c0.z = (float)local_148._0_4_;
            pbrt::Interaction::SpawnRay
                      ((RayDifferential *)local_2b0,(Interaction *)local_138,(Vector3f *)&local_2c0)
            ;
            local_358.data_ = (AssertHelperData *)local_2b0._0_8_;
            fStack_350 = (float)local_2b0._8_4_;
            fStack_34c = fStack_2a4;
            local_338.bits = local_290.bits;
            local_3b0._0_4_ = 0x7f800000;
            local_2b0._0_8_ = local_380;
            bVar5 = pbrt::DispatchSplit<6>::operator()
                              ((DispatchSplit<6> *)&local_3c8,&local_358,(Point3f *)local_3b0,
                               (RayDifferential *)local_2b0,local_378);
            local_3c0[0] = (DispatchSplit<6>)!bVar5;
            local_3b8.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (bVar5) {
              testing::Message::Message((Message *)local_3b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_2b0,(internal *)local_3c0,
                         (AssertionResult *)"tri.IntersectP(rOut)","true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_3c8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                         ,0xc0,(char *)local_2b0._0_8_);
              testing::internal::AssertHelper::operator=(&local_3c8,(Message *)local_3b0);
              testing::internal::AssertHelper::~AssertHelper(&local_3c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._0_8_ != &local_2a0) {
                operator_delete((void *)local_2b0._0_8_,
                                CONCAT44(local_2a0._M_allocated_capacity._4_4_,
                                         local_2a0._M_allocated_capacity._0_4_) + 1);
              }
              if (local_3b0 != (undefined1  [8])0x0) {
                bVar5 = testing::internal::IsTrue(true);
                if ((bVar5) && (local_3b0 != (undefined1  [8])0x0)) {
                  (**(code **)(*(long *)local_3b0 + 8))();
                }
                local_3b0 = (undefined1  [8])0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_3b8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_3c8.data_._0_4_ = 0x7f800000;
            local_3b0 = (undefined1  [8])local_380;
            expected_predicate_value = local_378;
            pbrt::DispatchSplit<6>::operator()
                      (local_2b0,(DispatchSplit<6> *)local_3a0,&local_358,&local_3c8,
                       (Point3f *)local_3b0);
            local_3c0[0] = (DispatchSplit<6>)(local_1b0 ^ 1);
            local_3b8.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (local_1b0 == 1) {
              testing::Message::Message((Message *)local_3b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_2b0,(internal *)local_3c0,
                         (AssertionResult *)"tri.Intersect(rOut).has_value()","true","false",
                         expected_predicate_value);
              testing::internal::AssertHelper::AssertHelper
                        (&local_3c8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                         ,0xc1,(char *)local_2b0._0_8_);
              testing::internal::AssertHelper::operator=(&local_3c8,(Message *)local_3b0);
              testing::internal::AssertHelper::~AssertHelper(&local_3c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._0_8_ != &local_2a0) {
                operator_delete((void *)local_2b0._0_8_,
                                CONCAT44(local_2a0._M_allocated_capacity._4_4_,
                                         local_2a0._M_allocated_capacity._0_4_) + 1);
              }
              if (local_3b0 != (undefined1  [8])0x0) {
                bVar5 = testing::internal::IsTrue(true);
                if ((bVar5) && (local_3b0 != (undefined1  [8])0x0)) {
                  (**(code **)(*(size_type *)local_3b0 + 8))();
                }
                local_3b0 = (undefined1  [8])0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_3b8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_3b0._0_4_ = 0.0;
            local_3b0._4_4_ = 0.0;
            local_3a8._0_4_ = 0.0;
            iVar16 = 0;
            do {
              uVar6 = (uint)(local_390 >> 0x2d) ^ (uint)(local_390 >> 0x1b);
              bVar11 = (byte)(local_390 >> 0x3b);
              auVar18 = vcvtusi2ss_avx512f(in_ZMM4._0_16_,uVar6 >> bVar11 | uVar6 << 0x20 - bVar11);
              auVar18 = vminss_avx(ZEXT416((uint)(auVar18._0_4_ * 2.3283064e-10)),
                                   SUB6416(ZEXT464(0x3f7fffff),0));
              auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * 8.0)),
                                        ZEXT416((uint)(1.0 - auVar18._0_4_)),ZEXT416(0xc1000000));
              local_390 = local_390 * 0x5851f42d4c957f2d + local_388;
              dVar19 = pow(10.0,(double)auVar18._0_4_);
              pPVar10 = (Point3f *)local_3b0;
              if ((iVar16 != 0) && (pPVar10 = (Point3f *)(local_3b0 + 4), iVar16 != 1)) {
                pPVar10 = (Point3f *)local_3a8;
              }
              (pPVar10->super_Tuple3<pbrt::Point3,_float>).x = (float)dVar19;
              iVar16 = iVar16 + 1;
            } while (iVar16 != 3);
            pbrt::Interaction::SpawnRayTo
                      ((Ray *)local_2b0,(Interaction *)local_138,(Point3f *)local_3b0);
            local_358.data_ = (AssertHelperData *)local_2b0._0_8_;
            fStack_350 = (float)local_2b0._8_4_;
            fStack_34c = fStack_2a4;
            local_338.bits = local_290.bits;
            local_3c8.data_._0_4_ = 0x3f800000;
            local_2b0._0_8_ = local_380;
            bVar5 = pbrt::DispatchSplit<6>::operator()
                              ((DispatchSplit<6> *)local_3a0,&local_358,&local_3c8,(Ray *)local_2b0,
                               local_378);
            local_3c0[0] = (DispatchSplit<6>)!bVar5;
            local_3b8.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (bVar5) {
              testing::Message::Message((Message *)&local_3c8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_2b0,(internal *)local_3c0,
                         (AssertionResult *)"tri.IntersectP(rOut, 1)","true","false",
                         expected_predicate_value);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_3a0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                         ,0xc9,(char *)local_2b0._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_3a0,(Message *)&local_3c8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._0_8_ != &local_2a0) {
                operator_delete((void *)local_2b0._0_8_,
                                CONCAT44(local_2a0._M_allocated_capacity._4_4_,
                                         local_2a0._M_allocated_capacity._0_4_) + 1);
              }
              if (local_3c8.data_ != (AssertHelperData *)0x0) {
                bVar5 = testing::internal::IsTrue(true);
                if ((bVar5) && (local_3c8.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_3c8.data_ + 8))();
                }
                local_3c8.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_3b8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_3a0[0] = 1.0;
            local_3c8.data_ = (AssertHelperData *)local_380;
            in_R9 = local_378;
            pbrt::DispatchSplit<6>::operator()(local_2b0,&local_391,&local_358,local_3a0,&local_3c8)
            ;
            local_3c0[0] = (DispatchSplit<6>)(local_1b0 ^ 1);
            local_3b8.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (local_1b0 == 1) {
              testing::Message::Message((Message *)&local_3c8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_2b0,(internal *)local_3c0,
                         (AssertionResult *)"tri.Intersect(rOut, 1).has_value()","true","false",
                         in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_3a0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                         ,0xca,(char *)local_2b0._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_3a0,(Message *)&local_3c8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._0_8_ != &local_2a0) {
                operator_delete((void *)local_2b0._0_8_,
                                CONCAT44(local_2a0._M_allocated_capacity._4_4_,
                                         local_2a0._M_allocated_capacity._0_4_) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8.data_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                bVar5 = testing::internal::IsTrue(true);
                if ((bVar5) &&
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3c8.data_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0)) {
                  (**(code **)(*(size_type *)local_3c8.data_ + 8))();
                }
                local_3c8.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_3b8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            iVar14 = iVar14 + 1;
          } while (iVar14 != 1000);
        }
        bVar5 = false;
        lVar13 = local_360;
        if (local_38 == '\x01') {
          local_38 = '\0';
        }
      }
      if (local_150 == '\x01') {
        local_150 = '\0';
      }
    }
    if ((bVar5) || (lVar13 = lVar13 + 1, lVar13 == 1000)) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Triangle, Reintersect) {
    for (int i = 0; i < 1000; ++i) {
        RNG rng(i);
        ShapeHandle tri = GetRandomTriangle([&]() { return pExp(rng); });
        if (!tri)
            continue;

        // Sample a point on the triangle surface to shoot the ray toward.
        Point2f u;
        u[0] = rng.Uniform<Float>();
        u[1] = rng.Uniform<Float>();
        auto ts = tri.Sample(u);
        ASSERT_TRUE(ts.has_value());

        // Choose a ray origin.
        Point3f o;
        for (int j = 0; j < 3; ++j)
            o[j] = pExp(rng);

        // Intersect the ray with the triangle.
        Ray r(o, ts->intr.p() - o);
        auto si = tri.Intersect(r);
        if (!si)
            // We should almost always find an intersection, but rarely
            // miss, due to round-off error. Just do another go-around in
            // this case.
            continue;
        SurfaceInteraction &isect = si->intr;

        // Now trace a bunch of rays leaving the intersection point.
        for (int j = 0; j < 1000; ++j) {
            // Random direction leaving the intersection point.
            Point2f u;
            u[0] = rng.Uniform<Float>();
            u[1] = rng.Uniform<Float>();
            Vector3f w = SampleUniformSphere(u);
            Ray rOut = isect.SpawnRay(w);
            EXPECT_FALSE(tri.IntersectP(rOut));
            EXPECT_FALSE(tri.Intersect(rOut).has_value());

            // Choose a random point to trace rays to.
            Point3f p2;
            for (int k = 0; k < 3; ++k)
                p2[k] = pExp(rng);
            rOut = isect.SpawnRayTo(p2);

            EXPECT_FALSE(tri.IntersectP(rOut, 1));
            EXPECT_FALSE(tri.Intersect(rOut, 1).has_value());
        }
    }
}